

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_delegate_implementation(writer *w,TypeDef *type)

{
  MethodDef MVar1;
  anon_class_16_2_3ed68039_conflict1 local_1c0;
  anon_class_8_1_89897ddb_conflict1 local_1b0;
  anon_class_8_1_89897ddb_conflict1 local_1a8;
  anon_class_8_1_89897ddb local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  table_base *local_188;
  uint32_t local_180;
  MethodDef local_168;
  undefined1 local_158 [8];
  method_signature signature;
  generic_param_guard guard;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  char *format;
  TypeDef *type_local;
  writer *w_local;
  
  winmd::reader::TypeDef::GenericParam
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard,type);
  writer::push_generic_params
            ((writer *)&signature.m_return.super_row_base<winmd::reader::Param>.m_index,
             (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)w);
  MVar1 = get_delegate_method(type);
  local_188 = MVar1.super_row_base<winmd::reader::MethodDef>.m_table;
  local_180 = MVar1.super_row_base<winmd::reader::MethodDef>.m_index;
  local_168.super_row_base<winmd::reader::MethodDef>.m_table = local_188;
  local_168.super_row_base<winmd::reader::MethodDef>.m_index = local_180;
  method_signature::method_signature((method_signature *)local_158,&local_168);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_198,
             "    template <typename H%> struct delegate<%, H> final : implements_delegate<%, H>\n    {\n        delegate(H&& handler) : implements_delegate<%, H>(std::forward<H>(handler)) {}\n\n        int32_t __stdcall Invoke(%) noexcept final try\n        {\n%            %\n            return 0;\n        }\n        catch (...) { return to_hresult(); }\n    };\n"
            );
  local_1a0 = bind<&cppwinrt::write_comma_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                        ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard);
  local_1a8 = bind<&cppwinrt::write_abi_params,_cppwinrt::method_signature_&>
                        ((method_signature *)local_158);
  local_1b0 = bind<&cppwinrt::write_produce_cleanup,_cppwinrt::method_signature_&>
                        ((method_signature *)local_158);
  local_1c0 = bind<&cppwinrt::write_produce_upcall,_const_char_(&)[8],_cppwinrt::method_signature_&>
                        ((char (*) [8])"(*this)",(method_signature *)local_158);
  writer_base<cppwinrt::writer>::
  write<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_winmd::reader::TypeDef,_winmd::reader::TypeDef,_winmd::reader::TypeDef,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
            (&w->super_writer_base<cppwinrt::writer>,&local_198,&local_1a0,type,type,type,&local_1a8
             ,&local_1b0,&local_1c0);
  method_signature::~method_signature((method_signature *)local_158);
  writer::generic_param_guard::~generic_param_guard
            ((generic_param_guard *)&signature.m_return.super_row_base<winmd::reader::Param>.m_index
            );
  return;
}

Assistant:

static void write_delegate_implementation(writer& w, TypeDef const& type)
    {
        auto format = R"(    template <typename H%> struct delegate<%, H> final : implements_delegate<%, H>
    {
        delegate(H&& handler) : implements_delegate<%, H>(std::forward<H>(handler)) {}

        int32_t __stdcall Invoke(%) noexcept final try
        {
%            %
            return 0;
        }
        catch (...) { return to_hresult(); }
    };
)";

        auto generics = type.GenericParam();
        auto guard{ w.push_generic_params(generics) };
        method_signature signature{ get_delegate_method(type) };

        w.write(format,
            bind<write_comma_generic_typenames>(generics),
            type,
            type,
            type,
            bind<write_abi_params>(signature),
            bind<write_produce_cleanup>(signature),
            bind<write_produce_upcall>("(*this)", signature));
    }